

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  bool bVar1;
  TestCaseInfo *pTVar2;
  ostream *poVar3;
  ulong uVar4;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> pVar5;
  SourceLineInfo local_350;
  SourceLineInfo local_328;
  _Rb_tree_const_iterator<Catch::TestCase> local_300;
  reference local_2f8;
  TestCase *prev;
  undefined1 local_2e8;
  _Self local_2e0;
  _Self local_2d8;
  undefined4 local_2cc;
  string local_2c8 [32];
  TestCase local_2a8;
  ostringstream local_1c0 [8];
  ostringstream oss;
  string local_38 [8];
  string name;
  TestCase *testCase_local;
  TestRegistry *this_local;
  
  pTVar2 = TestCase::getTestCaseInfo(testCase);
  std::__cxx11::string::string(local_38,(string *)pTVar2);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar3 = std::operator<<((ostream *)local_1c0,"Anonymous test case ");
    uVar4 = this->m_unnamedCount + 1;
    this->m_unnamedCount = uVar4;
    std::ostream::operator<<(poVar3,uVar4);
    std::__cxx11::ostringstream::str();
    TestCase::withName(&local_2a8,testCase,local_2c8);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_2a8);
    TestCase::~TestCase(&local_2a8);
    std::__cxx11::string::~string((string *)local_2c8);
    local_2cc = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  else {
    local_2d8._M_node =
         (_Base_ptr)
         std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
         find(&this->m_functions,testCase);
    local_2e0._M_node =
         (_Base_ptr)
         std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
         end(&this->m_functions);
    bVar1 = std::operator==(&local_2d8,&local_2e0);
    if (!bVar1) {
      local_300._M_node =
           (_Base_ptr)
           std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
           find(&this->m_functions,testCase);
      local_2f8 = std::_Rb_tree_const_iterator<Catch::TestCase>::operator*(&local_300);
      poVar3 = std::operator<<((ostream *)&std::cerr,"error: TEST_CASE( \"");
      poVar3 = std::operator<<(poVar3,local_38);
      poVar3 = std::operator<<(poVar3,"\" ) already defined.\n");
      poVar3 = std::operator<<(poVar3,"\tFirst seen at ");
      pTVar2 = TestCase::getTestCaseInfo(local_2f8);
      SourceLineInfo::SourceLineInfo(&local_328,&pTVar2->lineInfo);
      poVar3 = operator<<(poVar3,&local_328);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tRedefined at ");
      pTVar2 = TestCase::getTestCaseInfo(testCase);
      SourceLineInfo::SourceLineInfo(&local_350,&pTVar2->lineInfo);
      poVar3 = operator<<(poVar3,&local_350);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      SourceLineInfo::~SourceLineInfo(&local_350);
      SourceLineInfo::~SourceLineInfo(&local_328);
      exit(1);
    }
    pVar5 = std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
            ::insert(&this->m_functions,testCase);
    prev = (TestCase *)pVar5.first._M_node;
    local_2e8 = pVar5.second;
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (&this->m_functionsInOrder,testCase);
    bVar1 = TestCase::isHidden(testCase);
    if (!bVar1) {
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                (&this->m_nonHiddenFunctions,testCase);
    }
    local_2cc = 0;
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

virtual void registerTest( TestCase const& testCase ) {
            std::string name = testCase.getTestCaseInfo().name;
            if( name == "" ) {
                std::ostringstream oss;
                oss << "Anonymous test case " << ++m_unnamedCount;
                return registerTest( testCase.withName( oss.str() ) );
            }

            if( m_functions.find( testCase ) == m_functions.end() ) {
                m_functions.insert( testCase );
                m_functionsInOrder.push_back( testCase );
                if( !testCase.isHidden() )
                    m_nonHiddenFunctions.push_back( testCase );
            }
            else {
                TestCase const& prev = *m_functions.find( testCase );
                std::cerr   << "error: TEST_CASE( \"" << name << "\" ) already defined.\n"
                            << "\tFirst seen at " << SourceLineInfo( prev.getTestCaseInfo().lineInfo ) << "\n"
                            << "\tRedefined at " << SourceLineInfo( testCase.getTestCaseInfo().lineInfo ) << std::endl;
                exit(1);
            }
        }